

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O1

cell_index_t itree_add_child(itree_t *t,cell_index_t parent,cell_id_t id)

{
  cell_t *pcVar1;
  uint uVar2;
  uint uVar3;
  cell_index_t cVar4;
  ulong uVar5;
  ulong uVar6;
  
  pcVar1 = t->cell;
  uVar3 = pcVar1[parent].child;
  uVar6 = (ulong)uVar3;
  if (uVar6 == 0xffffffff) {
    uVar3 = t->n_cell;
    if (t->max_n_cell <= uVar3) {
      __assert_fail("t->n_cell < t->max_n_cell",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/itree.c"
                    ,0x4d,"cell_index_t itree_new_cell(itree_t *)");
    }
    t->n_cell = uVar3 + 1;
    pcVar1[parent].child = uVar3;
    pcVar1[uVar3].id = id;
    pcVar1[uVar3].child = 0xffffffff;
    pcVar1[uVar3].sib = 0xffffffff;
  }
  else {
    if (pcVar1[uVar6].id == 0xffffffff) {
      cVar4 = uVar3;
      uVar3 = 0xffffffff;
    }
    else {
      cVar4 = 0xffffffff;
      if (pcVar1[uVar6].id != id) {
        uVar2 = pcVar1[uVar6].sib;
        while (cVar4 = uVar3, uVar3 = uVar2, uVar2 != 0xffffffff) {
          uVar5 = (ulong)uVar2;
          if (pcVar1[uVar5].id == id) {
            cVar4 = (cell_index_t)uVar6;
            break;
          }
          uVar6 = uVar5;
          uVar2 = pcVar1[uVar5].sib;
        }
      }
    }
    if (uVar3 == 0xffffffff) {
      cVar4 = itree_add_sib(t,cVar4,id);
      return cVar4;
    }
  }
  return uVar3;
}

Assistant:

cell_index_t itree_add_child(itree_t *t,
			     cell_index_t parent,
			     cell_id_t id)
{
    cell_index_t end;
    cell_index_t child;
    cell_index_t new;
    cell_t *cell;

    cell = t->cell;

    if (cell[parent].child == NO_ID) {
	new = itree_new_cell(t);

	cell[parent].child = new;

	cell[new].id = id;
	cell[new].sib = NULL_INDEX;
	cell[new].child = NULL_INDEX;

	child = new;
    }
    else {
	child = itree_find(t, &end, cell[parent].child, id);
	if (child == NULL_INDEX) {
	    child = itree_add_sib(t, end, id);
	}
    }

    return child;
}